

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall spoa::Graph::TopologicalSort(Graph *this)

{
  allocator<bool> *this_00;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  pointer pNVar4;
  reference pvVar5;
  reference ppNVar6;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *this_01;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *pvVar7;
  reference __args;
  reference rVar8;
  Node **jt_2;
  iterator __end6;
  iterator __begin6;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range6;
  _Bit_type local_160;
  reference local_158;
  value_type *local_148;
  Node **jt_1;
  iterator __end5;
  iterator __begin5;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range5;
  _Bit_type local_120;
  reference local_118;
  Edge **jt;
  iterator __end4;
  iterator __begin4;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range4;
  value_type pNStack_f0;
  bool is_valid;
  value_type curr;
  reference local_e0;
  unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> *it;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  *__range1;
  stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
  stack;
  undefined1 local_68 [8];
  vector<bool,_std::allocator<bool>_> ignored;
  allocator<unsigned_char> local_2a;
  value_type_conflict2 local_29;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> marks;
  Graph *this_local;
  
  marks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::clear
            (&this->rank_to_node_);
  sVar3 = std::
          vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
          ::size(&this->nodes_);
  local_29 = '\0';
  std::allocator<unsigned_char>::allocator(&local_2a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,sVar3,&local_29,
             &local_2a);
  std::allocator<unsigned_char>::~allocator(&local_2a);
  sVar3 = std::
          vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
          ::size(&this->nodes_);
  stack.c.super__Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
  this_00 = (allocator<bool> *)
            ((long)&stack.c.
                    super__Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node + 6);
  std::allocator<bool>::allocator(this_00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_68,sVar3,
             (bool *)((long)&stack.c.
                             super__Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node + 7),this_00);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&stack.c.
                     super__Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_node + 6));
  std::stack<spoa::Graph::Node*,std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>>::
  stack<std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>,void>
            ((stack<spoa::Graph::Node*,std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>>
              *)&__range1);
  __end1 = std::
           vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ::begin(&this->nodes_);
  it = (unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> *)
       std::
       vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
       ::end(&this->nodes_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_*,_std::vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>_>
                                *)&it);
    if (!bVar1) {
      bVar1 = IsTopologicallySorted(this);
      if (bVar1) {
        std::
        stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
        ::~stack((stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                  *)&__range1);
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)local_68);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
        return;
      }
      __assert_fail("IsTopologicallySorted() && \"Graph is not topologically sorted\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]spoa/src/graph.cpp",
                    0x12e,"void spoa::Graph::TopologicalSort()");
    }
    local_e0 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_*,_std::vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>_>
               ::operator*(&__end1);
    pNVar4 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::operator->
                       (local_e0);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,
                        (ulong)pNVar4->id);
    if (*pvVar5 == '\0') {
      curr = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::get
                       (local_e0);
      std::
      stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
      ::push((stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
              *)&__range1,&curr);
      while( true ) {
        bVar1 = std::
                stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                ::empty((stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                         *)&__range1);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        ppNVar6 = std::
                  stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                  ::top((stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                         *)&__range1);
        pNStack_f0 = *ppNVar6;
        bVar1 = true;
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,
                            (ulong)pNStack_f0->id);
        if (*pvVar5 != '\x02') {
          this_01 = &pNStack_f0->inedges;
          __end4 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                             (this_01);
          jt = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                                  (this_01);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              (&__end4,(__normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                        *)&jt);
            if (!bVar2) break;
            local_118 = __gnu_cxx::
                        __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                        ::operator*(&__end4);
            pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,
                                (ulong)(*local_118)->tail->id);
            if (*pvVar5 != '\x02') {
              std::
              stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
              ::push((stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                      *)&__range1,&(*local_118)->tail);
              bVar1 = false;
            }
            __gnu_cxx::
            __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
            ::operator++(&__end4);
          }
          rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_68,(ulong)pNStack_f0->id);
          local_120 = rVar8._M_mask;
          __range5 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)rVar8._M_p
          ;
          bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range5);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            pvVar7 = &pNStack_f0->aligned_nodes;
            __end5 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                               (pvVar7);
            jt_1 = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                            end(pvVar7);
            while( true ) {
              bVar2 = __gnu_cxx::operator!=
                                (&__end5,(__normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                          *)&jt_1);
              if (!bVar2) break;
              local_148 = __gnu_cxx::
                          __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                          ::operator*(&__end5);
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,
                                  (ulong)(*local_148)->id);
              if (*pvVar5 != '\x02') {
                std::
                stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                ::push((stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                        *)&__range1,local_148);
                rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)local_68,
                                   (ulong)(*local_148)->id);
                local_158 = rVar8;
                std::_Bit_reference::operator=(&local_158,true);
                bVar1 = false;
              }
              __gnu_cxx::
              __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
              ::operator++(&__end5);
            }
          }
          if (bVar1) {
LAB_0011546a:
            bVar2 = true;
          }
          else {
            pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,
                                (ulong)pNStack_f0->id);
            bVar2 = false;
            if (*pvVar5 != '\x01') goto LAB_0011546a;
          }
          if (!bVar2) {
            __assert_fail("(is_valid || marks[curr->id] != 1) && \"Graph is not a DAG\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]spoa/src/graph.cpp"
                          ,0x119,"void spoa::Graph::TopologicalSort()");
          }
          if (bVar1) {
            pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,
                                (ulong)pNStack_f0->id);
            *pvVar5 = '\x02';
            rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)local_68,(ulong)pNStack_f0->id
                              );
            local_160 = rVar8._M_mask;
            __range6 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                       rVar8._M_p;
            bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range6);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
              emplace_back<spoa::Graph::Node*&>
                        ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                         &this->rank_to_node_,&stack0xffffffffffffff10);
              pvVar7 = &pNStack_f0->aligned_nodes;
              __end6 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                                 (pvVar7);
              jt_2 = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                              ::end(pvVar7);
              while( true ) {
                bVar2 = __gnu_cxx::operator!=
                                  (&__end6,(__normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                            *)&jt_2);
                if (!bVar2) break;
                __args = __gnu_cxx::
                         __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                         ::operator*(&__end6);
                std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                emplace_back<spoa::Graph::Node*const&>
                          ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                           &this->rank_to_node_,__args);
                __gnu_cxx::
                __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                ::operator++(&__end6);
              }
            }
          }
          else {
            pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,
                                (ulong)pNStack_f0->id);
            *pvVar5 = '\x01';
          }
        }
        if (bVar1) {
          std::
          stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
          ::pop((stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                 *)&__range1);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_*,_std::vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void Graph::TopologicalSort() {
  rank_to_node_.clear();

  std::vector<std::uint8_t> marks(nodes_.size(), 0);
  std::vector<bool> ignored(nodes_.size(), 0);

  std::stack<Node*> stack;
  for (const auto& it : nodes_) {
    if (marks[it->id] != 0) {
      continue;
    }
    stack.push(it.get());
    while (!stack.empty()) {
      auto curr = stack.top();
      bool is_valid = true;
      if (marks[curr->id] != 2) {
        for (const auto& jt : curr->inedges) {
          if (marks[jt->tail->id] != 2) {
            stack.push(jt->tail);
            is_valid = false;
          }
        }
        if (!ignored[curr->id]) {
          for (const auto& jt : curr->aligned_nodes) {
            if (marks[jt->id] != 2) {
              stack.push(jt);
              ignored[jt->id] = true;
              is_valid = false;
            }
          }
        }

        assert((is_valid || marks[curr->id] != 1) && "Graph is not a DAG");

        if (is_valid) {
          marks[curr->id] = 2;
          if (!ignored[curr->id]) {
            rank_to_node_.emplace_back(curr);
            for (const auto& jt : curr->aligned_nodes) {
              rank_to_node_.emplace_back(jt);
            }
          }
        } else {
          marks[curr->id] = 1;
        }
      }

      if (is_valid) {
        stack.pop();
      }
    }
  }

  assert(IsTopologicallySorted() && "Graph is not topologically sorted");
}